

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O2

void nn_sipc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  
  if (type == -3 && src == -2) {
    nn_pipebase_stop((nn_pipebase *)(self + 6));
    nn_streamhdr_stop((nn_streamhdr *)&self[1].state);
    *(undefined4 *)&self[1].fn = 7;
  }
  else if (*(int *)&self[1].fn != 7) {
    nn_backtrace_print();
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)&self[1].fn,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/sipc.c"
            ,0xcb);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar1 = nn_streamhdr_isidle((nn_streamhdr *)&self[1].state);
  if (iVar1 != 0) {
    nn_usock_swap_owner((nn_usock *)self[1].shutdown_fn,(nn_fsm_owner *)&self[5].stopped.type);
    self[1].shutdown_fn = (nn_fsm_fn)0x0;
    self[5].stopped.type = -1;
    self[5].stopped.item.next = (nn_queue_item *)0x0;
    *(undefined4 *)&self[1].fn = 1;
    nn_fsm_stopped(self,2);
    return;
  }
  return;
}

Assistant:

static void nn_sipc_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_sipc *sipc;

    sipc = nn_cont (self, struct nn_sipc, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_pipebase_stop (&sipc->pipebase);
        nn_streamhdr_stop (&sipc->streamhdr);
        sipc->state = NN_SIPC_STATE_STOPPING;
    }
    if (nn_slow (sipc->state == NN_SIPC_STATE_STOPPING)) {
        if (nn_streamhdr_isidle (&sipc->streamhdr)) {
            nn_usock_swap_owner (sipc->usock, &sipc->usock_owner);
            sipc->usock = NULL;
            sipc->usock_owner.src = -1;
            sipc->usock_owner.fsm = NULL;
            sipc->state = NN_SIPC_STATE_IDLE;
            nn_fsm_stopped (&sipc->fsm, NN_SIPC_STOPPED);
            return;
        }
        return;
    }

    nn_fsm_bad_state(sipc->state, src, type);
}